

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

void __thiscall
QGraphicsView::fitInView(QGraphicsView *this,QRectF *rect,AspectRatioMode aspectRatioMode)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long lVar5;
  QWidgetData *pQVar6;
  undefined1 auVar7 [16];
  int iVar8;
  QWidget *pQVar9;
  long lVar10;
  qreal *pqVar11;
  QPointF *pQVar12;
  long in_FS_OFFSET;
  byte bVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  int iVar19;
  int iVar20;
  undefined1 auVar21 [16];
  QTransform matrix;
  QRectF local_c8;
  QRectF local_a8;
  QPointF local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  long local_30;
  
  bVar13 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = *(long *)(*(long *)(this + 8) + 0x490);
  if ((((lVar5 != 0) && (*(int *)(lVar5 + 4) != 0)) && (*(long *)(*(long *)(this + 8) + 0x498) != 0)
      ) && (((rect->w != 0.0 || (NAN(rect->w))) || ((rect->h != 0.0 || (NAN(rect->h))))))) {
    local_a8.w._0_4_ = 0xffffffff;
    local_a8.w._4_4_ = 0xffffffff;
    local_a8.h._0_4_ = 0xffffffff;
    local_a8.h._4_4_ = 0xffffffff;
    local_a8.xp._0_4_ = 0xffffffff;
    local_a8.xp._4_4_ = 0xffffffff;
    local_a8.yp._0_4_ = 0xffffffff;
    local_a8.yp._4_4_ = 0xffffffff;
    local_88.xp = 0.0;
    local_88.yp = 0.0;
    local_78 = 0x3ff0000000000000;
    uStack_70 = 0x3ff0000000000000;
    QTransform::mapRect(&local_a8);
    if ((0.0 < (double)CONCAT44(local_a8.w._4_4_,local_a8.w._0_4_)) &&
       (0.0 < (double)CONCAT44(local_a8.h._4_4_,local_a8.h._0_4_))) {
      lVar5 = *(long *)(this + 8);
      pqVar11 = (qreal *)&DAT_00704bf8;
      pQVar12 = &local_88;
      for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
        (*(qreal (*) [3])&pQVar12->xp)[0] = *pqVar11;
        pqVar11 = pqVar11 + (ulong)bVar13 * -2 + 1;
        pQVar12 = (QPointF *)&pQVar12[-(ulong)bVar13].yp;
      }
      pqVar11 = (qreal *)(lVar5 + 0x3a0);
      pQVar12 = &local_88;
      for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
        (*(qreal (*) [3])&pQVar12->xp)[0] = *pqVar11;
        pqVar11 = pqVar11 + (ulong)bVar13 * -2 + 1;
        pQVar12 = (QPointF *)&pQVar12[-(ulong)bVar13].yp;
      }
      QTransform::scale(1.0 / (double)CONCAT44(local_a8.w._4_4_,local_a8.w._0_4_),
                        1.0 / (double)CONCAT44(local_a8.h._4_4_,local_a8.h._0_4_));
      setTransform(this,(QTransform *)&local_88,false);
      pQVar9 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      pQVar6 = pQVar9->data;
      uVar1 = (pQVar6->crect).x2;
      uVar3 = (pQVar6->crect).y2;
      uVar2 = (pQVar6->crect).x1;
      uVar4 = (pQVar6->crect).y1;
      iVar19 = (uVar1 - uVar2) + -2;
      iVar20 = (uVar3 - uVar4) + -2;
      auVar15._0_4_ = -(uint)(1 < iVar19);
      auVar15._4_4_ = -(uint)(1 < iVar19);
      auVar15._8_4_ = -(uint)(1 < iVar20);
      auVar15._12_4_ = -(uint)(1 < iVar20);
      iVar8 = movmskpd((int)pQVar6,auVar15);
      if (iVar8 == 3) {
        local_c8.w._0_4_ = 0xffffffff;
        local_c8.w._4_4_ = 0xffffffff;
        local_c8.h._0_4_ = 0xffffffff;
        local_c8.h._4_4_ = 0xffffffff;
        local_c8.xp._0_4_ = 0xffffffff;
        local_c8.xp._4_4_ = 0xffffffff;
        local_c8.yp._0_4_ = 0xffffffff;
        local_c8.yp._4_4_ = 0xffffffff;
        QTransform::mapRect(&local_c8);
        auVar7._8_4_ = local_c8.h._0_4_;
        auVar7._0_8_ = CONCAT44(local_c8.w._4_4_,local_c8.w._0_4_);
        auVar7._12_4_ = local_c8.h._4_4_;
        if ((0.0 < (double)CONCAT44(local_c8.w._4_4_,local_c8.w._0_4_)) && (0.0 < auVar7._8_8_)) {
          auVar21._4_4_ = iVar20;
          auVar21._0_4_ = iVar19;
          auVar21._8_4_ = iVar20;
          auVar21._12_4_ = -(uint)(iVar20 < 0);
          auVar16._0_8_ = (double)(CONCAT44(-(uint)(iVar19 < 0),iVar19) + -1);
          auVar16._8_8_ = (double)(auVar21._8_8_ + -1);
          auVar17 = divpd(auVar16,auVar7);
          dVar14 = auVar17._0_8_;
          dVar18 = auVar17._8_8_;
          if (aspectRatioMode == KeepAspectRatioByExpanding) {
            if (dVar18 <= dVar14) {
              dVar18 = dVar14;
            }
            auVar17._8_8_ = dVar18;
            auVar17._0_8_ = dVar18;
          }
          else if (aspectRatioMode == KeepAspectRatio) {
            if (dVar18 <= dVar14) {
              dVar14 = dVar18;
            }
            auVar17._8_8_ = dVar14;
            auVar17._0_8_ = dVar14;
          }
          lVar5 = *(long *)(this + 8);
          pqVar11 = (qreal *)&DAT_00704bf8;
          pQVar12 = &local_88;
          for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
            (*(qreal (*) [3])&pQVar12->xp)[0] = *pqVar11;
            pqVar11 = pqVar11 + (ulong)bVar13 * -2 + 1;
            pQVar12 = (QPointF *)&pQVar12[-(ulong)bVar13].yp;
          }
          pqVar11 = (qreal *)(lVar5 + 0x3a0);
          pQVar12 = &local_88;
          for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
            (*(qreal (*) [3])&pQVar12->xp)[0] = *pqVar11;
            pqVar11 = pqVar11 + (ulong)bVar13 * -2 + 1;
            pQVar12 = (QPointF *)&pQVar12[-(ulong)bVar13].yp;
          }
          QTransform::scale(auVar17._0_8_,auVar17._8_8_);
          setTransform(this,(QTransform *)&local_88,false);
          local_88.yp = rect->h * 0.5 + rect->yp;
          local_88.xp = rect->w * 0.5 + rect->xp;
          centerOn(this,&local_88);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::fitInView(const QRectF &rect, Qt::AspectRatioMode aspectRatioMode)
{
    Q_D(QGraphicsView);
    if (!d->scene || rect.isNull())
        return;

    // Reset the view scale to 1:1.
    QRectF unity = d->matrix.mapRect(QRectF(0, 0, 1, 1));
    if (unity.isEmpty())
        return;
    scale(1 / unity.width(), 1 / unity.height());

    // Find the ideal x / y scaling ratio to fit \a rect in the view.
    int margin = 2;
    QRectF viewRect = viewport()->rect().adjusted(margin, margin, -margin, -margin);
    if (viewRect.isEmpty())
        return;
    QRectF sceneRect = d->matrix.mapRect(rect);
    if (sceneRect.isEmpty())
        return;
    qreal xratio = viewRect.width() / sceneRect.width();
    qreal yratio = viewRect.height() / sceneRect.height();

    // Respect the aspect ratio mode.
    switch (aspectRatioMode) {
    case Qt::KeepAspectRatio:
        xratio = yratio = qMin(xratio, yratio);
        break;
    case Qt::KeepAspectRatioByExpanding:
        xratio = yratio = qMax(xratio, yratio);
        break;
    case Qt::IgnoreAspectRatio:
        break;
    }

    // Scale and center on the center of \a rect.
    scale(xratio, yratio);
    centerOn(rect.center());
}